

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O3

void nga_zadd_patch_(DoubleComplex *alpha,Integer *g_a,Integer *alo,Integer *ahi,DoubleComplex *beta
                    ,Integer *g_b,Integer *blo,Integer *bhi,Integer *g_c,Integer *clo,Integer *chi)

{
  Integer ctype;
  Integer btype;
  Integer atype;
  
  pnga_inquire_type(*g_a,&atype);
  pnga_inquire_type(*g_b,&btype);
  pnga_inquire_type(*g_c,&ctype);
  if (((atype != btype) || (atype != 0x3ef)) || (ctype != 0x3ef)) {
    pnga_error(" wrong types ",0);
  }
  pnga_add_patch(alpha,*g_a,alo,ahi,beta,*g_b,blo,bhi,*g_c,clo,chi);
  return;
}

Assistant:

void FATR nga_zadd_patch_(DoubleComplex *alpha, Integer *g_a, Integer *alo, Integer *ahi, DoubleComplex *beta, Integer *g_b, Integer *blo, Integer *bhi, Integer *g_c, Integer *clo, Integer *chi)
{
    Integer atype, btype, ctype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    pnga_inquire_type(*g_c, &ctype);
    if (atype != btype || atype != ctype || atype != C_DCPL)
        pnga_error(" wrong types ", 0L);
    wnga_add_patch(alpha, *g_a, alo, ahi, beta, *g_b, blo, bhi, *g_c, clo, chi);
}